

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::tryRead
          (HttpInputStreamImpl *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  Coroutine<unsigned_long> *this_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar1;
  ulong uVar2;
  void *__src;
  SourceLocation location;
  coroutine_handle<void> handle;
  unsigned_long uVar3;
  ulong in_R8;
  PromiseAwaiter<unsigned_long> *pPVar4;
  bool bVar5;
  Fault f;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  Fault local_60;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  local_58;
  
  handle._M_fr_ptr = operator_new(0x5e0);
  *(code **)handle._M_fr_ptr = tryRead;
  *(code **)((long)handle._M_fr_ptr + 8) = tryRead;
  this_00 = (Coroutine<unsigned_long> *)((long)handle._M_fr_ptr + 0x10);
  local_58.left = (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)0x4d3fd6;
  local_58.right = (None *)0x4d57ed;
  local_58.op.content.ptr = (char *)0x1300000654;
  location.function = "tryRead";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x654;
  location.columnNumber = 0x13;
  kj::_::Coroutine<unsigned_long>::Coroutine(this_00,handle,location);
  kj::_::Coroutine<unsigned_long>::get_return_object((Coroutine<unsigned_long> *)this);
  local_58.left =
       (Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_> *)((long)buffer + 0xd8);
  bVar5 = *(long *)((long)buffer + 0xe0) == 0;
  local_58.right = (None *)&kj::none;
  local_58.op.content.ptr = anon_var_dwarf_43885;
  local_58.op.content.size_ = 5;
  local_58.result = !bVar5;
  if (bVar5) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,0x657,FAILED,"onMessageDone != kj::none","_kjCondition,",&local_58);
    kj::_::Debug::Fault::fatal(&local_60);
  }
  uVar2 = *(ulong *)((long)buffer + 0x40);
  if (uVar2 == 0) {
    pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5c0);
    (**(code **)(**(long **)((long)buffer + 0x10) + 8))
              (pOVar1,*(long **)((long)buffer + 0x10),minBytes,maxBytes);
    pPVar4 = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x240);
    co_await<unsigned_long>(pPVar4,(Promise<unsigned_long> *)pOVar1);
    *(undefined1 *)((long)handle._M_fr_ptr + 0x5d8) = 0;
    bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                      ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
    if (bVar5) {
      return (PromiseBase)(PromiseBase)this;
    }
    uVar3 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(pPVar4);
    kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
              ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,uVar3);
    kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(pPVar4);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
  }
  else {
    __src = *(void **)((long)buffer + 0x38);
    if (uVar2 < in_R8) {
      memcpy((void *)minBytes,__src,uVar2);
      uVar2 = *(ulong *)((long)buffer + 0x40);
      *(ulong *)((long)handle._M_fr_ptr + 0x5d0) = uVar2;
      *(undefined8 *)((long)buffer + 0x38) = 0;
      *(undefined8 *)((long)buffer + 0x40) = 0;
      if (maxBytes < uVar2 || maxBytes - uVar2 == 0) {
        kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                  ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,uVar2);
      }
      else {
        pOVar1 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x5c8)
        ;
        (**(code **)(**(long **)((long)buffer + 0x10) + 8))
                  (pOVar1,*(long **)((long)buffer + 0x10),minBytes + uVar2,maxBytes - uVar2,
                   in_R8 - uVar2);
        pPVar4 = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x400);
        co_await<unsigned_long>(pPVar4,(Promise<unsigned_long> *)pOVar1);
        *(undefined1 *)((long)handle._M_fr_ptr + 0x5d8) = 1;
        bVar5 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                          ((PromiseAwaiterBase *)pPVar4,(CoroutineBase *)this_00);
        if (bVar5) {
          return (PromiseBase)(PromiseBase)this;
        }
        uVar3 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(pPVar4);
        kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(pPVar4);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(pOVar1);
        kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                  ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,
                   uVar3 + *(long *)((long)handle._M_fr_ptr + 0x5d0));
      }
    }
    else {
      memcpy((void *)minBytes,__src,in_R8);
      *(long *)((long)buffer + 0x38) = *(long *)((long)buffer + 0x38) + in_R8;
      *(long *)((long)buffer + 0x40) = *(long *)((long)buffer + 0x40) - in_R8;
      kj::_::CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long>::return_value
                ((CoroutineMixin<kj::_::Coroutine<unsigned_long>,_unsigned_long> *)this_00,in_R8);
    }
  }
  *(undefined8 *)handle._M_fr_ptr = 0;
  *(undefined1 *)((long)handle._M_fr_ptr + 0x5d8) = 2;
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) {
    // Read message body data.

    KJ_REQUIRE(onMessageDone != kj::none);

    if (leftover == nullptr) {
      // No leftovers. Forward directly to inner stream.
      co_return co_await inner.tryRead(buffer, minBytes, maxBytes);
    } else if (leftover.size() >= maxBytes) {
      // Didn't even read the entire leftover buffer.
      memcpy(buffer, leftover.begin(), maxBytes);
      leftover = leftover.slice(maxBytes, leftover.size());
      co_return maxBytes;
    } else {
      // Read the entire leftover buffer, plus some.
      memcpy(buffer, leftover.begin(), leftover.size());
      size_t copied = leftover.size();
      leftover = nullptr;
      if (copied >= minBytes) {
        // Got enough to stop here.
        co_return copied;
      } else {
        // Read the rest from the underlying stream.
        auto n = co_await inner.tryRead(reinterpret_cast<byte*>(buffer) + copied,
                             minBytes - copied, maxBytes - copied);
        co_return n + copied;
      }
    }
  }